

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRange.cxx
# Opt level: O0

int testRange(int param_1,char **param_2)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  bool bVar1;
  difference_type dVar2;
  ostream *poVar3;
  cmRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_> cVar4
  ;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5e8;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_378;
  cmRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  local_360;
  cmRange<RangeIterators::TransformIterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_micst[P]CMake_Tests_CMakeLib_testRange_cxx:40:3)>_>
  local_350;
  cmRange<RangeIterators::TransformIterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_micst[P]CMake_Tests_CMakeLib_testRange_cxx:40:3)>_>
  local_330;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30f;
  undefined1 local_30e;
  allocator<char> local_30d;
  allocator<char> local_30c;
  allocator<char> local_30b;
  allocator<char> local_30a;
  allocator<char> local_309;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  iterator local_260;
  size_type local_258;
  undefined1 local_250 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  stringRange;
  cmRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  local_220;
  cmRange<RangeIterators::FilterIterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_micst[P]CMake_Tests_CMakeLib_testRange_cxx:36:3)>_>
  local_210;
  allocator<int> local_1d9;
  int local_1d8 [8];
  iterator local_1b8;
  size_type local_1b0;
  undefined1 local_1a8 [8];
  vector<int,_std::allocator<int>_> evenData;
  cmRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  local_188;
  cmRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  local_170;
  cmRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  local_158;
  cmRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  local_148;
  cmRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  local_138;
  cmRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  local_128;
  cmRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  local_118;
  cmRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  local_108;
  cmRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  local_f8;
  cmRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  local_e8;
  cmRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  local_d8;
  cmRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  local_c8;
  cmRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  local_b8;
  cmRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  local_a8;
  undefined4 local_94;
  cmRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  local_90 [2];
  allocator<int> local_69;
  int local_68 [10];
  iterator local_40;
  size_type local_38;
  undefined1 local_30 [8];
  vector<int,_std::allocator<int>_> testData;
  char **param_6_local;
  int param_5_local;
  
  local_68[8] = 9;
  local_68[9] = 10;
  local_68[4] = 5;
  local_68[5] = 6;
  local_68[6] = 7;
  local_68[7] = 8;
  local_68[0] = 1;
  local_68[1] = 2;
  local_68[2] = 3;
  local_68[3] = 4;
  local_40 = local_68;
  local_38 = 10;
  testData.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)param_2;
  std::allocator<int>::allocator(&local_69);
  __l_01._M_len = local_38;
  __l_01._M_array = local_40;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_30,__l_01,&local_69);
  std::allocator<int>::~allocator(&local_69);
  local_90[0] = cmMakeRange<std::vector<int,_std::allocator<int>_>_>
                          ((vector<int,_std::allocator<int>_> *)local_30);
  bVar1 = cmRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
          ::empty(local_90);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "ASSERT_TRUE(!cmMakeRange(testData).empty()) failed on line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x16);
    std::operator<<(poVar3,"\n");
    local_94 = 1;
  }
  else {
    local_a8 = cmMakeRange<std::vector<int,_std::allocator<int>_>_>
                         ((vector<int,_std::allocator<int>_> *)local_30);
    dVar2 = cmRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
            ::size(&local_a8);
    if (dVar2 == 10) {
      local_c8 = cmMakeRange<std::vector<int,_std::allocator<int>_>_>
                           ((vector<int,_std::allocator<int>_> *)local_30);
      local_b8 = cmRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                 ::advance(&local_c8,5);
      bVar1 = cmRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
              ::empty(&local_b8);
      if (bVar1) {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(!cmMakeRange(testData).advance(5).empty()) failed on line "
                                );
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x19);
        std::operator<<(poVar3,"\n");
        local_94 = 1;
      }
      else {
        local_e8 = cmMakeRange<std::vector<int,_std::allocator<int>_>_>
                             ((vector<int,_std::allocator<int>_> *)local_30);
        local_d8 = cmRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                   ::advance(&local_e8,5);
        dVar2 = cmRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                ::size(&local_d8);
        if (dVar2 == 5) {
          local_118 = cmMakeRange<std::vector<int,_std::allocator<int>_>_>
                                ((vector<int,_std::allocator<int>_> *)local_30);
          local_108 = cmRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                      ::advance(&local_118,5);
          local_f8 = cmRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                     ::retreat(&local_108,5);
          bVar1 = cmRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                  ::empty(&local_f8);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            local_148 = cmMakeRange<std::vector<int,_std::allocator<int>_>_>
                                  ((vector<int,_std::allocator<int>_> *)local_30);
            local_138 = cmRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                        ::advance(&local_148,5);
            local_128 = cmRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                        ::retreat(&local_138,5);
            dVar2 = cmRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                    ::size(&local_128);
            if (dVar2 == 0) {
              local_158 = cmMakeRange<std::vector<int,_std::allocator<int>_>_>
                                    ((vector<int,_std::allocator<int>_> *)local_30);
              bVar1 = cmRange<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                      ::any_of<testRange(int,char**)::__0>
                                ((cmRange<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                                  *)&local_158);
              if (((bVar1 ^ 0xffU) & 1) == 0) {
                local_170 = cmMakeRange<std::vector<int,_std::allocator<int>_>_>
                                      ((vector<int,_std::allocator<int>_> *)local_30);
                bVar1 = cmRange<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                        ::all_of<testRange(int,char**)::__1>
                                  ((cmRange<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                                    *)&local_170);
                if (((bVar1 ^ 0xffU) & 1) == 0) {
                  local_188 = cmMakeRange<std::vector<int,_std::allocator<int>_>_>
                                        ((vector<int,_std::allocator<int>_> *)local_30);
                  bVar1 = cmRange<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                          ::none_of<testRange(int,char**)::__2>
                                    ((cmRange<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                                      *)&local_188);
                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                    local_1d8[0] = 2;
                    local_1d8[1] = 4;
                    local_1d8[2] = 6;
                    local_1d8[3] = 8;
                    local_1d8[4] = 10;
                    local_1b8 = local_1d8;
                    local_1b0 = 5;
                    std::allocator<int>::allocator(&local_1d9);
                    __l_00._M_len = local_1b0;
                    __l_00._M_array = local_1b8;
                    std::vector<int,_std::allocator<int>_>::vector
                              ((vector<int,_std::allocator<int>_> *)local_1a8,__l_00,&local_1d9);
                    std::allocator<int>::~allocator(&local_1d9);
                    local_220 = cmMakeRange<std::vector<int,_std::allocator<int>_>_>
                                          ((vector<int,_std::allocator<int>_> *)local_30);
                    cmRange<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                    ::filter<testRange(int,char**)::__3>
                              (&local_210,
                               (cmRange<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                                *)&local_220);
                    cVar4 = cmMakeRange<std::vector<int,_std::allocator<int>_>_>
                                      ((vector<int,_std::allocator<int>_> *)local_1a8);
                    stringRange.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)cVar4.Begin._M_current;
                    bVar1 = operator==(&local_210,
                                       (cmRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                                        *)&stringRange.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    if (((bVar1 ^ 0xffU) & 1) == 0) {
                      local_30e = 1;
                      local_308 = &local_300;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_300,"1",&local_309);
                      local_308 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_2e0;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>(local_2e0,"2",&local_30a);
                      local_308 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_2c0;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>(local_2c0,"3",&local_30b);
                      local_308 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_2a0;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>(local_2a0,"4",&local_30c);
                      local_308 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_280;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>(local_280,"5",&local_30d);
                      local_30e = 0;
                      local_260 = &local_300;
                      local_258 = 5;
                      std::
                      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::allocator(&local_30f);
                      __l._M_len = local_258;
                      __l._M_array = local_260;
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_250,__l,&local_30f);
                      std::
                      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~allocator(&local_30f);
                      local_5e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&local_260;
                      do {
                        local_5e8 = local_5e8 + -1;
                        std::__cxx11::string::~string((string *)local_5e8);
                      } while (local_5e8 != &local_300);
                      std::allocator<char>::~allocator(&local_30d);
                      std::allocator<char>::~allocator(&local_30c);
                      std::allocator<char>::~allocator(&local_30b);
                      std::allocator<char>::~allocator(&local_30a);
                      std::allocator<char>::~allocator(&local_309);
                      local_360 = cmMakeRange<std::vector<int,_std::allocator<int>_>_>
                                            ((vector<int,_std::allocator<int>_> *)local_30);
                      cmRange<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                      ::transform<testRange(int,char**)::__4>
                                (&local_350,
                                 (cmRange<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                                  *)&local_360);
                      cmRange<RangeIterators::TransformIterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Tests/CMakeLib/testRange.cxx:40:3)>_>
                      ::retreat(&local_330,&local_350,5);
                      local_378 = cmMakeRange<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              *)local_250);
                      bVar1 = operator==(&local_330,&local_378);
                      if (((bVar1 ^ 0xffU) & 1) != 0) {
                        poVar3 = std::operator<<((ostream *)&std::cout,
                                                 "ASSERT_TRUE(cmMakeRange(testData) .transform([](int n) { return std::to_string(n); }) .retreat(5) == cmMakeRange(stringRange)) failed on line "
                                                );
                        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x2a);
                        std::operator<<(poVar3,"\n");
                      }
                      local_94 = 1;
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_250);
                    }
                    else {
                      poVar3 = std::operator<<((ostream *)&std::cout,
                                               "ASSERT_TRUE(cmMakeRange(testData).filter([](int n) { return n % 2 == 0; }) == cmMakeRange(evenData)) failed on line "
                                              );
                      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x25);
                      std::operator<<(poVar3,"\n");
                      local_94 = 1;
                    }
                    std::vector<int,_std::allocator<int>_>::~vector
                              ((vector<int,_std::allocator<int>_> *)local_1a8);
                  }
                  else {
                    poVar3 = std::operator<<((ostream *)&std::cout,
                                             "ASSERT_TRUE(cmMakeRange(testData).none_of([](int n) { return n > 11; })) failed on line "
                                            );
                    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x21);
                    std::operator<<(poVar3,"\n");
                    local_94 = 1;
                  }
                }
                else {
                  poVar3 = std::operator<<((ostream *)&std::cout,
                                           "ASSERT_TRUE(cmMakeRange(testData).all_of([](int n) { return n < 11; })) failed on line "
                                          );
                  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x20);
                  std::operator<<(poVar3,"\n");
                  local_94 = 1;
                }
              }
              else {
                poVar3 = std::operator<<((ostream *)&std::cout,
                                         "ASSERT_TRUE(cmMakeRange(testData).any_of([](int n) { return n % 3 == 0; })) failed on line "
                                        );
                poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1f);
                std::operator<<(poVar3,"\n");
                local_94 = 1;
              }
            }
            else {
              poVar3 = std::operator<<((ostream *)&std::cout,
                                       "ASSERT_TRUE(cmMakeRange(testData).advance(5).retreat(5).size() == 0) failed on line "
                                      );
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1d);
              std::operator<<(poVar3,"\n");
              local_94 = 1;
            }
          }
          else {
            poVar3 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(cmMakeRange(testData).advance(5).retreat(5).empty()) failed on line "
                                    );
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1c);
            std::operator<<(poVar3,"\n");
            local_94 = 1;
          }
        }
        else {
          poVar3 = std::operator<<((ostream *)&std::cout,
                                   "ASSERT_TRUE(cmMakeRange(testData).advance(5).size() == 5) failed on line "
                                  );
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1a);
          std::operator<<(poVar3,"\n");
          local_94 = 1;
        }
      }
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(cmMakeRange(testData).size() == 10) failed on line ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x17);
      std::operator<<(poVar3,"\n");
      local_94 = 1;
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_30);
  return 0;
}

Assistant:

int testRange(int /*unused*/, char* /*unused*/ [])
{
  std::vector<int> const testData = { 1, 2, 3, 4, 5, 6, 7, 8, 9, 10 };

  ASSERT_TRUE(!cmMakeRange(testData).empty());
  ASSERT_TRUE(cmMakeRange(testData).size() == 10);

  ASSERT_TRUE(!cmMakeRange(testData).advance(5).empty());
  ASSERT_TRUE(cmMakeRange(testData).advance(5).size() == 5);

  ASSERT_TRUE(cmMakeRange(testData).advance(5).retreat(5).empty());
  ASSERT_TRUE(cmMakeRange(testData).advance(5).retreat(5).size() == 0);

  ASSERT_TRUE(cmMakeRange(testData).any_of([](int n) { return n % 3 == 0; }));
  ASSERT_TRUE(cmMakeRange(testData).all_of([](int n) { return n < 11; }));
  ASSERT_TRUE(cmMakeRange(testData).none_of([](int n) { return n > 11; }));

  std::vector<int> const evenData = { 2, 4, 6, 8, 10 };
  ASSERT_TRUE(cmMakeRange(testData).filter([](int n) { return n % 2 == 0; }) ==
              cmMakeRange(evenData));

  std::vector<std::string> const stringRange = { "1", "2", "3", "4", "5" };
  ASSERT_TRUE(cmMakeRange(testData)
                .transform([](int n) { return std::to_string(n); })
                .retreat(5) == cmMakeRange(stringRange));

  return 0;
}